

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_false,_true>::DaTrie(DaTrie<true,_false,_true> *this,istream *is)

{
  istream *in_RDI;
  istream *val;
  istream *is_00;
  istream *vec;
  istream *is_01;
  
  is_01 = in_RDI;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::vector
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x18d8a4);
  val = in_RDI + 0x18;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x18d8b7);
  is_00 = in_RDI + 0x30;
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::vector
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x18d8ca);
  vec = in_RDI + 0x48;
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::vector
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x18d8dd);
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  utils::read_vector<ddd::Bc>((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)vec,is_00);
  utils::read_vector<char>((vector<char,_std::allocator<char>_> *)vec,is_00);
  utils::read_vector<ddd::BlockLink>
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)vec,is_00);
  utils::read_vector<ddd::NodeLink>
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)vec,is_00);
  utils::read_value<unsigned_int>((uint *)val,is_01);
  utils::read_value<unsigned_int>((uint *)val,is_01);
  utils::read_value<unsigned_int>((uint *)val,is_01);
  return;
}

Assistant:

DaTrie(std::istream& is) {
    utils::read_vector(bc_, is);
    utils::read_vector(tail_, is);
    utils::read_vector(blocks_, is);
    utils::read_vector(node_links_, is);
    utils::read_value(head_pos_, is);
    utils::read_value(bc_emps_, is);
    utils::read_value(tail_emps_, is);
  }